

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RealLiteral * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RealLiteral,slang::ast::Type_const&,double,slang::SourceRange>
          (BumpAllocator *this,Type *args,double *args_1,SourceRange *args_2)

{
  SourceRange sourceRange;
  RealLiteral *pRVar1;
  double in_RCX;
  Type *in_RDX;
  RealLiteral *in_RSI;
  SourceLocation in_RDI;
  SourceLocation unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  
  pRVar1 = (RealLiteral *)allocate((BumpAllocator *)in_RDX,(size_t)in_RCX,in_stack_ffffffffffffffd8)
  ;
  sourceRange.endLoc = unaff_retaddr;
  sourceRange.startLoc = in_RDI;
  ast::RealLiteral::RealLiteral(in_RSI,in_RDX,in_RCX,sourceRange);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }